

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall Centaurus::NFA<wchar_t>::parse_unit(NFA<wchar_t> *this,Stream *stream,wchar_t ch)

{
  StreamException *__return_storage_ptr__;
  CharClass<wchar_t> local_330;
  CharClass<wchar_t> local_310;
  CharClass<wchar_t> local_2f0;
  CharClass<wchar_t> local_2d0;
  CharClass<wchar_t> local_2b0;
  CharClass<wchar_t> local_290;
  CharClass<wchar_t> local_270;
  CharClass<wchar_t> local_250;
  CharClass<wchar_t> local_230;
  CharClass<wchar_t> local_210;
  CharClass<wchar_t> local_1f0;
  CharClass<wchar_t> local_1d0;
  CharClass<wchar_t> local_1b0;
  CharClass<wchar_t> local_190;
  CharClass<wchar_t> local_170;
  CharClass<wchar_t> local_150;
  CharClass<wchar_t> local_130;
  CharClass<wchar_t> local_110;
  CharClass<wchar_t> local_f0;
  CharClass<wchar_t> local_d0;
  NFA<wchar_t> local_b0;
  CharClass<wchar_t> local_90;
  CharClass<wchar_t> local_70;
  CharClass<wchar_t> local_40;
  wchar_t local_1c;
  Stream *pSStack_18;
  wchar_t ch_local;
  Stream *stream_local;
  NFA<wchar_t> *this_local;
  
  local_1c = ch;
  pSStack_18 = stream;
  stream_local = (Stream *)this;
  if (ch == L'(') {
    NFA(&local_b0,stream);
    concat(this,&local_b0);
    ~NFA(&local_b0);
  }
  else if (ch == L'.') {
    CharClass<wchar_t>::make_star();
    add_state(this,&local_90);
    CharClass<wchar_t>::~CharClass(&local_90);
  }
  else if (ch == L'[') {
    CharClass<wchar_t>::CharClass(&local_70,stream);
    add_state(this,&local_70);
    CharClass<wchar_t>::~CharClass(&local_70);
  }
  else if (ch == L'\\') {
    local_1c = Stream::get(stream);
    switch(local_1c) {
    case L'(':
    case L')':
    case L'*':
    case L'+':
    case L'.':
    case L'?':
    case L'[':
    case L'\\':
    case L']':
    case L'{':
    case L'|':
    case L'}':
      CharClass<wchar_t>::CharClass(&local_40,local_1c);
      add_state(this,&local_40);
      CharClass<wchar_t>::~CharClass(&local_40);
      break;
    default:
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,pSStack_18,local_1c);
      __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                  StreamException::~StreamException);
    }
  }
  else {
    CharClass<wchar_t>::CharClass(&local_d0,ch);
    add_state(this,&local_d0);
    CharClass<wchar_t>::~CharClass(&local_d0);
  }
  local_1c = Stream::peek(pSStack_18);
  if (local_1c == L'*') {
    Stream::discard(pSStack_18);
    local_1c = Stream::peek(pSStack_18);
    if (local_1c == L'*') {
      Stream::discard(pSStack_18);
      CharClass<wchar_t>::CharClass(&local_230);
      add_transition_to(this,&local_230,1,false);
      CharClass<wchar_t>::~CharClass(&local_230);
      CharClass<wchar_t>::CharClass(&local_250);
      add_state(this,&local_250);
      CharClass<wchar_t>::~CharClass(&local_250);
      CharClass<wchar_t>::CharClass(&local_270);
      add_transition_from(this,&local_270,1);
      CharClass<wchar_t>::~CharClass(&local_270);
    }
    else if (local_1c == L'+') {
      Stream::discard(pSStack_18);
      CharClass<wchar_t>::CharClass(&local_170);
      add_transition_to(this,&local_170,1,true);
      CharClass<wchar_t>::~CharClass(&local_170);
      CharClass<wchar_t>::CharClass(&local_190);
      add_state(this,&local_190);
      CharClass<wchar_t>::~CharClass(&local_190);
      CharClass<wchar_t>::CharClass(&local_1b0);
      add_transition_from(this,&local_1b0,1);
      CharClass<wchar_t>::~CharClass(&local_1b0);
    }
    else if (local_1c == L'?') {
      Stream::discard(pSStack_18);
      CharClass<wchar_t>::CharClass(&local_1d0);
      add_transition_to(this,&local_1d0,1,false);
      CharClass<wchar_t>::~CharClass(&local_1d0);
      CharClass<wchar_t>::CharClass(&local_1f0);
      add_state(this,&local_1f0);
      CharClass<wchar_t>::~CharClass(&local_1f0);
      CharClass<wchar_t>::CharClass(&local_210);
      add_transition_from(this,&local_210,1);
      CharClass<wchar_t>::~CharClass(&local_210);
    }
    else {
      CharClass<wchar_t>::CharClass(&local_290);
      add_transition_to(this,&local_290,1,false);
      CharClass<wchar_t>::~CharClass(&local_290);
      CharClass<wchar_t>::CharClass(&local_2b0);
      add_state(this,&local_2b0);
      CharClass<wchar_t>::~CharClass(&local_2b0);
      CharClass<wchar_t>::CharClass(&local_2d0);
      add_transition_from(this,&local_2d0,1);
      CharClass<wchar_t>::~CharClass(&local_2d0);
    }
  }
  else if (local_1c == L'+') {
    Stream::discard(pSStack_18);
    local_1c = Stream::peek(pSStack_18);
    if (local_1c == L'*') {
      Stream::discard(pSStack_18);
      CharClass<wchar_t>::CharClass(&local_130);
      add_transition_to(this,&local_130,1,false);
      CharClass<wchar_t>::~CharClass(&local_130);
    }
    else if (local_1c == L'+') {
      Stream::discard(pSStack_18);
      CharClass<wchar_t>::CharClass(&local_f0);
      add_transition_to(this,&local_f0,1,true);
      CharClass<wchar_t>::~CharClass(&local_f0);
    }
    else if (local_1c == L'?') {
      Stream::discard(pSStack_18);
      CharClass<wchar_t>::CharClass(&local_110);
      add_transition_to(this,&local_110,1,false);
      CharClass<wchar_t>::~CharClass(&local_110);
    }
    else {
      CharClass<wchar_t>::CharClass(&local_150);
      add_transition_to(this,&local_150,1,false);
      CharClass<wchar_t>::~CharClass(&local_150);
    }
  }
  else if (local_1c == L'?') {
    Stream::discard(pSStack_18);
    local_1c = Stream::peek(pSStack_18);
    if (local_1c == L'*') {
      Stream::discard(pSStack_18);
      CharClass<wchar_t>::CharClass(&local_310);
      add_transition_from(this,&local_310,1);
      CharClass<wchar_t>::~CharClass(&local_310);
    }
    else if (local_1c == L'?') {
      Stream::discard(pSStack_18);
      CharClass<wchar_t>::CharClass(&local_2f0);
      add_transition_from(this,&local_2f0,1);
      CharClass<wchar_t>::~CharClass(&local_2f0);
    }
    else {
      CharClass<wchar_t>::CharClass(&local_330);
      add_transition_from(this,&local_330,1);
      CharClass<wchar_t>::~CharClass(&local_330);
    }
  }
  return;
}

Assistant:

void parse_unit(Stream& stream, wchar_t ch)
    {
        switch (ch)
        {
        case L'\\':
            ch = stream.get();
            switch (ch)
            {
            case L'[':
            case L']':
            case L'+':
            case L'*':
            case L'{':
            case L'}':
            case L'?':
            case L'\\':
            case L'|':
            case L'(':
            case L')':
            case L'.':
                add_state(CharClass<TCHAR>(ch));
                break;
            default:
                throw stream.unexpected(ch);
            }
            break;
        case L'[':
            add_state(CharClass<TCHAR>(stream));
            break;
        case L'.':
            add_state(CharClass<TCHAR>::make_star());
            break;
        case L'(':
            concat(NFA<TCHAR>(stream));
            break;
        default:
            add_state(CharClass<TCHAR>(ch));
            break;
        }
        ch = stream.peek();
        switch (ch)
        {
        case L'+':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'+':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1, true);
                break;
            case L'?':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        case L'*':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'+':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1, true);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'?':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        case L'?':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'?':
                stream.discard();
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        }
    }